

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::NameProvider::NameProvider
          (NameProvider *this,CStringRef filename,CStringRef gen_name,size_t num_items)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t in_RCX;
  CStringRef in_RDX;
  NameProvider *in_RDI;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_01;
  string *__s;
  allocator<char> local_2f;
  allocator<char> local_2e;
  NameProvider *this_02;
  
  this_02 = in_RDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1ccdf5);
  __s = &in_RDI->gen_name_;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            fmt::BasicCStringRef<char>::c_str((BasicCStringRef<char> *)&stack0xfffffffffffffff0);
  this_01 = (BasicMemoryWriter<char,_std::allocator<char>_> *)&stack0xffffffffffffffd3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  alloc = &local_2e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_2e);
  internal::NameReader::NameReader((NameReader *)0x1cce95);
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(this_01,alloc);
  std::allocator<char>::~allocator(&local_2f);
  ReadNames(this_02,in_RDX,in_RCX);
  return;
}

Assistant:

mp::NameProvider::NameProvider(
    fmt::CStringRef filename, fmt::CStringRef gen_name, std::size_t num_items)
  : gen_name_(gen_name.c_str()) {
  ReadNames(filename, num_items);
}